

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O0

void remove_tractor_beam_from_ship(Am_Object *beam,Am_Object *ship)

{
  Am_Slot_Key AVar1;
  byte bVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Value_List local_28 [8];
  Am_Value_List beams;
  Am_Object *ship_local;
  Am_Object *beam_local;
  
  Am_Value_List::Am_Value_List(local_28);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)ship,(ulong)TB_LIST);
  Am_Value_List::operator=(local_28,pAVar3);
  Am_Value_List::Start();
  Am_Object::operator_cast_to_Am_Wrapper_(beam);
  bVar2 = Am_Value_List::Member((Am_Wrapper *)local_28);
  if ((bVar2 & 1) != 0) {
    Am_Value_List::Delete(SUB81(local_28,0));
  }
  AVar1 = TB_LIST;
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(local_28);
  Am_Object::Set((ushort)ship,(Am_Wrapper *)(ulong)AVar1,(ulong)pAVar4);
  Am_Value_List::~Am_Value_List(local_28);
  return;
}

Assistant:

void
remove_tractor_beam_from_ship(Am_Object beam, Am_Object ship)
{
  Am_Value_List beams;
  beams = ship.Get(TB_LIST);
  beams.Start();
  if (beams.Member(beam))
    beams.Delete();
  ship.Set(TB_LIST, beams);
}